

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O3

int s98c_set_part(s98c *ctx,int part)

{
  int iVar1;
  
  if ((ctx->header).version == -1) {
    s98c_set_part_cold_2();
    iVar1 = 1;
  }
  else if ((uint)part < (ctx->header).device_count * 2) {
    ctx->current_device = part;
    iVar1 = 0;
  }
  else {
    s98c_set_part_cold_1();
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int s98c_set_part(struct s98c* ctx, int part)
{
    if(ctx->header.version == -1) {
        fprintf(stderr, "error: Missing #version\n");
        return 1;
    }
    if(part >= ctx->header.device_count * 2) {
        fprintf(stderr, "error: Use of part %c exceeds number of defined #device's\n",
                part + 'A');
        return 2;
    }

    ctx->current_device = part;
    return 0;
}